

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg.cpp
# Opt level: O2

void duckdb::IntegerAverageOperation::Finalize<double,duckdb::AvgState<long>>
               (AvgState<long> *state,double *target,AggregateFinalizeData *finalize_data)

{
  uint64_t uVar1;
  FunctionData *pFVar2;
  undefined1 auVar3 [16];
  optional_ptr<duckdb::FunctionData,_true> local_30;
  double local_28;
  double dStack_20;
  
  uVar1 = state->count;
  if (uVar1 != 0) {
    local_30.ptr = (finalize_data->input->bind_data).ptr;
    auVar3._8_4_ = (int)(uVar1 >> 0x20);
    auVar3._0_8_ = uVar1;
    auVar3._12_4_ = 0x45300000;
    dStack_20 = auVar3._8_8_ - 1.9342813113834067e+25;
    local_28 = dStack_20 + ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
    if (local_30.ptr != (FunctionData *)0x0) {
      pFVar2 = optional_ptr<duckdb::FunctionData,_true>::operator->(&local_30);
      local_28 = local_28 * (double)pFVar2[1]._vptr_FunctionData;
    }
    *target = (double)state->value / local_28;
    return;
  }
  AggregateFinalizeData::ReturnNull(finalize_data);
  return;
}

Assistant:

static void Finalize(STATE &state, T &target, AggregateFinalizeData &finalize_data) {
		if (state.count == 0) {
			finalize_data.ReturnNull();
		} else {
			double divident = GetAverageDivident<double>(state.count, finalize_data.input.bind_data);
			target = double(state.value) / divident;
		}
	}